

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebug.cxx
# Opt level: O2

int testDebug(int argc,char **param_2)

{
  bool bVar1;
  ostream *poVar2;
  bool in_CL;
  undefined1 value;
  size_type sVar3;
  uint uVar4;
  allocator<char> local_c1;
  string local_c0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  char local_68 [8];
  undefined8 uStack_60;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (argc == 1) {
    cm::anon_unknown_0::dbg_impl<bool>((char *)0x16,0x76ef33,&DAT_00000001,in_CL);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"CMAKE_NO_DBG",(allocator<char> *)&str);
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a0,&local_c0);
    bVar1 = local_a0._M_engaged;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (bVar1 == false) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                              );
      poVar2 = std::operator<<(poVar2,':');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x17);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,"4");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"CMAKE_NO_DBG",(allocator<char> *)&str);
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a0,&local_c0);
    bVar1 = local_a0._M_engaged;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (bVar1 == false) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                              );
      poVar2 = std::operator<<(poVar2,':');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x18);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,"1.");
      std::operator<<(poVar2," = ");
      poVar2 = std::ostream::_M_insert<double>(1.0);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"CMAKE_NO_DBG",(allocator<char> *)&str);
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a0,&local_c0);
    bVar1 = local_a0._M_engaged;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (bVar1 == false) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                              );
      poVar2 = std::operator<<(poVar2,':');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x19);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,"\'c\'");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = std::operator<<(poVar2,'c');
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"CMAKE_NO_DBG",(allocator<char> *)&str);
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a0,&local_c0);
    bVar1 = local_a0._M_engaged;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (bVar1 == false) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                              );
      poVar2 = std::operator<<(poVar2,':');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1a);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,"\"literal string\"");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = std::operator<<(poVar2,"literal string");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"literal string",(allocator<char> *)&local_c0);
    bVar1 = std::operator!=("literal string",
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "Failed to return std::string(\"literal string\") for CM_DBG(\"literal string\")"
                              );
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    uVar4 = (uint)bVar1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&str,"std string",(allocator<char> *)&local_a0);
    std::__cxx11::string::string((string *)&local_78,(string *)&str);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"CMAKE_NO_DBG",&local_c1)
    ;
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a0,&local_c0);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (local_a0._M_engaged == false) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Tests/CMakeLib/testDebug.cxx"
                              );
      poVar2 = std::operator<<(poVar2,':');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1d);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,"str");
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = std::operator<<(poVar2,(string *)&local_78);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    sVar3 = local_70;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    if (local_78 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68) {
      local_38.field_2._8_8_ = uStack_60;
    }
    else {
      local_38._M_dataplus._M_p = (pointer)local_78;
    }
    local_38._M_string_length = local_70;
    local_70 = 0;
    local_68[0] = '\0';
    local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_68;
    bVar1 = std::operator!=(&local_38,"std string");
    value = (undefined1)sVar3;
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "Failed to return \"std string\" for CM_DBG(str)");
      std::endl<char,std::char_traits<char>>(poVar2);
      uVar4 = 1;
    }
    cm::anon_unknown_0::dbg_impl<bool>
              ((char *)0x1e,0x7657b7,(char *)(ulong)(str._M_string_length == 0),(bool)value);
    if (str._M_string_length == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "Failed to return false for CM_DBG(str.empty())");
      std::endl<char,std::char_traits<char>>(poVar2);
      uVar4 = 1;
    }
    std::__cxx11::string::~string((string *)&str);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Invalid arguments.\n");
    uVar4 = 0xffffffff;
  }
  return uVar4;
}

Assistant:

int testDebug(int argc, char** const /*argv*/)
{
  if (argc != 1) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  int retval = 0;
  check(CM_DBG(true), true);
  check(CM_DBG(4), 4);
  check(CM_DBG(1.), 1.);
  check(CM_DBG('c'), 'c');
  check(CM_DBG("literal string"), std::string("literal string"));

  std::string str = "std string";
  check(CM_DBG(str), "std string");
  check(CM_DBG(str.empty()), false);

  return retval;
}